

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void flatbuffers::tests::UnicodeTest(void)

{
  bool expval;
  uint8_t *flatbuffer;
  char *pcVar1;
  char *result;
  string jsongen;
  IDLOptions local_a98;
  undefined1 local_788 [8];
  Parser parser;
  
  IDLOptions::IDLOptions(&local_a98);
  Parser::Parser((Parser *)local_788,&local_a98);
  IDLOptions::~IDLOptions(&local_a98);
  expval = Parser::Parse((Parser *)local_788,
                         "table T { F:string; }root_type T;{ F:\"\\u20AC\\u00A2\\u30E6\\u30FC\\u30B6\\u30FC\\u5225\\u30B5\\u30A4\\u30C8\\xE2\\x82\\xAC\\u0080\\uD83D\\uDE0E\" }"
                         ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(expval,true,
                    "\'parser.Parse(\"table T { F:string; }\" \"root_type T;\" \"{ F:\\\"\\\\u20AC\\\\u00A2\\\\u30E6\\\\u30FC\\\\u30B6\\\\u30FC\" \"\\\\u5225\\\\u30B5\\\\u30A4\\\\u30C8\\\\xE2\\\\x82\\\\xAC\\\\u0080\\\\uD8\" \"3D\\\\uDE0E\\\" }\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x2e3,"");
  std::__cxx11::string::string((string *)&result);
  parser.known_attributes_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0xffffffff;
  flatbuffer = FlatBufferBuilderImpl<false>::GetBufferPointer
                         ((FlatBufferBuilderImpl<false> *)((long)&parser.error_.field_2 + 8));
  pcVar1 = GenText((Parser *)local_788,flatbuffer,(string *)&result);
  TestEq<bool,bool>(true,pcVar1 == (char *)0x0,"\'nullptr\' != \'result\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                    ,0x2e7,"");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  TestEqStr(pcVar1,
            "{F: \"\\u20AC\\u00A2\\u30E6\\u30FC\\u30B6\\u30FC\\u5225\\u30B5\\u30A4\\u30C8\\u20AC\\u0080\\uD83D\\uDE0E\"}"
            ,
            "\'jsongen.c_str()\' != \'\"{F: \\\"\\\\u20AC\\\\u00A2\\\\u30E6\\\\u30FC\\\\u30B6\\\\u30FC\" \"\\\\u5225\\\\u30B5\\\\u30A4\\\\u30C8\\\\u20AC\\\\u0080\\\\uD83D\\\\uDE0E\\\"}\"\'"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
            ,0x2ea,"");
  std::__cxx11::string::~string((string *)&result);
  Parser::~Parser((Parser *)local_788);
  return;
}

Assistant:

void UnicodeTest() {
  flatbuffers::Parser parser;
  // Without setting allow_non_utf8 = true, we treat \x sequences as byte
  // sequences which are then validated as UTF-8.
  TEST_EQ(parser.Parse("table T { F:string; }"
                       "root_type T;"
                       "{ F:\"\\u20AC\\u00A2\\u30E6\\u30FC\\u30B6\\u30FC"
                       "\\u5225\\u30B5\\u30A4\\u30C8\\xE2\\x82\\xAC\\u0080\\uD8"
                       "3D\\uDE0E\" }"),
          true);
  std::string jsongen;
  parser.opts.indent_step = -1;
  auto result = GenText(parser, parser.builder_.GetBufferPointer(), &jsongen);
  TEST_NULL(result);
  TEST_EQ_STR(jsongen.c_str(),
              "{F: \"\\u20AC\\u00A2\\u30E6\\u30FC\\u30B6\\u30FC"
              "\\u5225\\u30B5\\u30A4\\u30C8\\u20AC\\u0080\\uD83D\\uDE0E\"}");
}